

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_3::CheckboxBase::~CheckboxBase(CheckboxBase *this)

{
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__CheckboxBase_00167ee0;
  CheckboxOption::~CheckboxOption(&(this->option_).owned_);
  std::__cxx11::string::~string((string *)&this->label_);
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

CheckboxBase(ConstStringRef label, bool* state, Ref<CheckboxOption> option)
      : label_(label), state_(state), option_(std::move(option)) {
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
    // Microsoft terminal do not use fonts able to render properly the default
    // radiobox glyph.
    if (option_->style_checked == "▣ ")
      option_->style_checked = "[X]";
    if (option_->style_unchecked == "☐ ")
      option_->style_unchecked = "[ ]";
#endif
  }